

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

char * __cxxabiv1::(anonymous_namespace)::
       parse_floating_number<long_double,__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  int iVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_RDX;
  long in_RSI;
  char *in_RDI;
  int n;
  char num [40];
  uint d0;
  uint d1;
  char *e;
  char *t;
  anon_union_16_2_325080ff anon_var_0;
  size_t N;
  value_type *__x;
  undefined2 uVar3;
  undefined6 in_stack_fffffffffffffee2;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int local_fc;
  int local_f8;
  char local_78 [40];
  int local_50;
  int local_4c;
  char *local_48;
  char *local_40;
  char local_38 [16];
  undefined8 local_28;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *local_20;
  char *local_18;
  char *local_10;
  
  local_28 = 0x14;
  local_10 = in_RDI;
  if (0x14 < (ulong)(in_RSI - (long)in_RDI)) {
    local_18 = in_RDI + 0x14;
    local_48 = local_38;
    local_20 = in_RDX;
    for (local_40 = in_RDI; local_40 != local_18; local_40 = local_40 + 1) {
      iVar1 = isxdigit((int)*local_40);
      if (iVar1 == 0) {
        return local_10;
      }
      iVar1 = isdigit((int)*local_40);
      if (iVar1 == 0) {
        local_f8 = *local_40 + -0x57;
      }
      else {
        local_f8 = *local_40 + -0x30;
      }
      local_4c = local_f8;
      local_40 = local_40 + 1;
      iVar1 = isdigit((int)*local_40);
      if (iVar1 == 0) {
        local_fc = *local_40 + -0x57;
      }
      else {
        local_fc = *local_40 + -0x30;
      }
      local_50 = local_fc;
      *local_48 = (char)(local_4c << 4) + (char)local_fc;
      local_48 = local_48 + 1;
    }
    if (*local_40 == 'E') {
      std::reverse<char*>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      local_78[0x18] = '\0';
      local_78[0x19] = '\0';
      local_78[0x1a] = '\0';
      local_78[0x1b] = '\0';
      local_78[0x1c] = '\0';
      local_78[0x1d] = '\0';
      local_78[0x1e] = '\0';
      local_78[0x1f] = '\0';
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = '\0';
      local_78[9] = '\0';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x20] = '\0';
      local_78[0x21] = '\0';
      local_78[0x22] = '\0';
      local_78[0x23] = '\0';
      local_78[0x24] = '\0';
      local_78[0x25] = '\0';
      local_78[0x26] = '\0';
      local_78[0x27] = '\0';
      __x = (value_type *)local_38._0_10_;
      uVar3 = SUB102(local_38._0_10_,8);
      uVar2 = snprintf(local_78,0x28,"%LaL");
      if (0x27 < uVar2) {
        return local_10;
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::basic_string(local_20,in_stack_fffffffffffffee8,CONCAT62(in_stack_fffffffffffffee2,uVar3),
                     (malloc_alloc<char> *)__x);
      anon_unknown_0::
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::string_pair((string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
                     *)CONCAT62(in_stack_fffffffffffffee2,uVar3),&__x->first);
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                   *)CONCAT62(in_stack_fffffffffffffee2,uVar3),__x);
      anon_unknown_0::
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::~string_pair((string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
                      *)CONCAT62(in_stack_fffffffffffffee2,uVar3));
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::~basic_string((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                       *)0x1e5c5c);
      local_10 = local_40 + 1;
    }
  }
  return local_10;
}

Assistant:

const char*
parse_floating_number(const char* first, const char* last, C& db)
{
    const size_t N = float_data<Float>::mangled_size;
    if (static_cast<std::size_t>(last - first) > N)
    {
        last = first + N;
        union
        {
            Float value;
            char buf[sizeof(Float)];
        };
        const char* t = first;
        char* e = buf;
        for (; t != last; ++t, ++e)
        {
            if (!isxdigit(*t))
                return first;
            unsigned d1 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            ++t;
            unsigned d0 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            *e = static_cast<char>((d1 << 4) + d0);
        }
        if (*t == 'E')
        {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
            std::reverse(buf, e);
#endif
            char num[float_data<Float>::max_demangled_size] = {0};
            int n = snprintf(num, sizeof(num), float_data<Float>::spec, value);
            if (static_cast<std::size_t>(n) >= sizeof(num))
                return first;
            db.names.push_back(typename C::String(num, static_cast<std::size_t>(n)));
            first = t+1;
        }
    }
    return first;
}